

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int AllocateInternalBuffers32b(VP8LDecoder *dec,int final_width)

{
  int iVar1;
  uint32_t *puVar2;
  long lVar3;
  
  lVar3 = (long)dec->height * (long)dec->width;
  puVar2 = (uint32_t *)
           WebPSafeMalloc((long)final_width * 0x10 + (ulong)(ushort)final_width + lVar3,4);
  dec->pixels = puVar2;
  if (puVar2 == (uint32_t *)0x0) {
    dec->argb_cache = (uint32_t *)0x0;
    iVar1 = 0;
    if ((dec->status == VP8_STATUS_SUSPENDED) || (dec->status == VP8_STATUS_OK)) {
      dec->status = VP8_STATUS_OUT_OF_MEMORY;
    }
  }
  else {
    dec->argb_cache = puVar2 + lVar3 + (ulong)(ushort)final_width;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int AllocateInternalBuffers32b(VP8LDecoder* const dec, int final_width) {
  const uint64_t num_pixels = (uint64_t)dec->width * dec->height;
  // Scratch buffer corresponding to top-prediction row for transforming the
  // first row in the row-blocks. Not needed for paletted alpha.
  const uint64_t cache_top_pixels = (uint16_t)final_width;
  // Scratch buffer for temporary BGRA storage. Not needed for paletted alpha.
  const uint64_t cache_pixels = (uint64_t)final_width * NUM_ARGB_CACHE_ROWS;
  const uint64_t total_num_pixels =
      num_pixels + cache_top_pixels + cache_pixels;

  assert(dec->width <= final_width);
  dec->pixels = (uint32_t*)WebPSafeMalloc(total_num_pixels, sizeof(uint32_t));
  if (dec->pixels == NULL) {
    dec->argb_cache = NULL;    // for soundness
    return VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
  }
  dec->argb_cache = dec->pixels + num_pixels + cache_top_pixels;
  return 1;
}